

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

void L16toGry(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  double dVar1;
  undefined1 local_40;
  undefined1 local_3c;
  double Y;
  uint8_t *gp;
  int16_t *l16;
  tmsize_t n_local;
  uint8_t *op_local;
  LogLuvState *sp_local;
  
  Y = (double)op;
  gp = sp->tbuf;
  l16 = (int16_t *)n;
  while (0 < (long)l16) {
    dVar1 = LogL16toY((int)*(short *)gp);
    if (0.0 < dVar1) {
      if (dVar1 < 1.0) {
        dVar1 = sqrt(dVar1);
        local_40 = (undefined1)(int)(dVar1 * 256.0);
      }
      else {
        local_40 = 0xff;
      }
      local_3c = local_40;
    }
    else {
      local_3c = 0;
    }
    *(undefined1 *)Y = local_3c;
    Y = (double)((long)Y + 1);
    gp = gp + 2;
    l16 = (int16_t *)((long)l16 + -1);
  }
  return;
}

Assistant:

static void L16toGry(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    int16_t *l16 = (int16_t *)sp->tbuf;
    uint8_t *gp = (uint8_t *)op;

    while (n-- > 0)
    {
        double Y = LogL16toY(*l16++);
        *gp++ = (uint8_t)((Y <= 0.)   ? 0
                          : (Y >= 1.) ? 255
                                      : (int)(256. * sqrt(Y)));
    }
}